

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O1

int av1_check_show_filtered_frame
              (YV12_BUFFER_CONFIG *frame,FRAME_DIFF *frame_diff,int q_index,
              aom_bit_depth_t bit_depth)

{
  int16_t iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  
  iVar2 = (frame->field_2).field_0.y_crop_width;
  iVar4 = (frame->field_3).field_0.y_crop_height;
  iVar3 = iVar4 + 0x1f;
  iVar4 = iVar4 + 0x3e;
  if (-1 < iVar3) {
    iVar4 = iVar3;
  }
  iVar3 = iVar2 + 0x1f;
  iVar2 = iVar2 + 0x3e;
  if (-1 < iVar3) {
    iVar2 = iVar3;
  }
  iVar2 = (iVar2 >> 5) * (iVar4 >> 5);
  iVar3 = 1;
  if (1 < iVar2) {
    iVar3 = iVar2;
  }
  fVar6 = (float)frame_diff->sum / (float)iVar3;
  fVar5 = (float)frame_diff->sse / (float)iVar3 - fVar6 * fVar6;
  if (fVar5 < 0.0) {
    fVar5 = sqrtf(fVar5);
  }
  else {
    fVar5 = SQRT(fVar5);
  }
  iVar1 = av1_ac_quant_QTX(q_index,0,bit_depth);
  if (((float)(int)iVar1 * 0.7 * (float)(int)iVar1 <= fVar6) || (iVar3 = 1, fVar6 * 1.2 <= fVar5)) {
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int av1_check_show_filtered_frame(const YV12_BUFFER_CONFIG *frame,
                                  const FRAME_DIFF *frame_diff, int q_index,
                                  aom_bit_depth_t bit_depth) {
  const int frame_height = frame->y_crop_height;
  const int frame_width = frame->y_crop_width;
  const int block_height = block_size_high[TF_BLOCK_SIZE];
  const int block_width = block_size_wide[TF_BLOCK_SIZE];
  const int mb_rows = get_num_blocks(frame_height, block_height);
  const int mb_cols = get_num_blocks(frame_width, block_width);
  const int num_mbs = AOMMAX(1, mb_rows * mb_cols);
  const float mean = (float)frame_diff->sum / num_mbs;
  const float std = (float)sqrt((float)frame_diff->sse / num_mbs - mean * mean);

  const int ac_q_step = av1_ac_quant_QTX(q_index, 0, bit_depth);
  const float threshold = 0.7f * ac_q_step * ac_q_step;

  if (mean < threshold && std < mean * 1.2) {
    return 1;
  }
  return 0;
}